

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void TableSettingsHandler_WriteAll
               (ImGuiContext *ctx,ImGuiSettingsHandler *handler,ImGuiTextBuffer *buf)

{
  float fVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  int iVar7;
  undefined4 extraout_EAX;
  undefined4 extraout_EAX_00;
  undefined4 uVar8;
  undefined8 uVar9;
  byte *pbVar10;
  uint uVar11;
  ulong uVar12;
  uint *puVar13;
  byte bVar14;
  bool bVar15;
  uint uVar16;
  
  pcVar4 = (ctx->SettingsTables).Buf.Data;
  if (pcVar4 != (char *)0x0) {
    puVar13 = (uint *)(pcVar4 + 4);
    do {
      if (*puVar13 != 0) {
        uVar2 = puVar13[1];
        uVar16 = -(uint)((uVar2 & 0xf) == 0);
        if ((uVar16 & 1) == 0) {
          iVar3 = (buf->Buf).Size;
          iVar7 = iVar3 + -1;
          if (iVar3 == 0) {
            iVar7 = 0;
          }
          ImGuiTextBuffer::reserve(buf,iVar7 + (char)puVar13[3] * 0x32 + 0x1e);
          ImGuiTextBuffer::appendf
                    (buf,"[%s][0x%08X,%d]\n",handler->TypeName,(ulong)*puVar13,
                     (ulong)(uint)(int)(char)puVar13[3]);
          fVar1 = (float)puVar13[2];
          if ((fVar1 != 0.0) || (uVar8 = extraout_EAX, NAN(fVar1))) {
            ImGuiTextBuffer::appendf(buf,"RefScale=%g\n",(double)fVar1);
            uVar8 = extraout_EAX_00;
          }
          if ('\0' < (char)puVar13[3]) {
            auVar6._4_4_ = -(uint)((uVar2 & 8) == 0);
            auVar6._0_4_ = uVar16;
            auVar6._8_4_ = -(uint)((uVar2 & 2) == 0);
            auVar6._12_4_ = -(uint)((uVar2 & 4) == 0);
            uVar16 = movmskps(uVar8,auVar6);
            bVar14 = ((byte)uVar16 & 2) >> 1;
            pbVar10 = (byte *)((long)puVar13 + 0x1b);
            uVar12 = 0;
            do {
              bVar5 = (uVar2 & 7) != 0;
              bVar15 = *(int *)(pbVar10 + -7) != 0 || bVar5;
              if (bVar14 == 0 && (*(int *)(pbVar10 + -7) == 0 && !bVar5)) {
                bVar15 = pbVar10[-1] != 0xff;
              }
              if (bVar15) {
                ImGuiTextBuffer::appendf(buf,"Column %-2d",uVar12);
                if (*(int *)(pbVar10 + -7) != 0) {
                  ImGuiTextBuffer::appendf(buf," UserID=%08X");
                }
                if ((uVar2 & 1) != 0) {
                  if ((*pbVar10 & 8) != 0) {
                    ImGuiTextBuffer::appendf(buf," Weight=%.4f",(double)*(float *)(pbVar10 + -0xb));
                  }
                  if ((*pbVar10 & 8) == 0) {
                    ImGuiTextBuffer::appendf
                              (buf," Width=%d",(ulong)(uint)(int)*(float *)(pbVar10 + -0xb));
                  }
                }
                if ((byte)((byte)uVar16 >> 3) == 0) {
                  ImGuiTextBuffer::appendf(buf," Visible=%d",(ulong)(*pbVar10 >> 2 & 1));
                }
                if ((uVar16 & 4) == 0) {
                  ImGuiTextBuffer::appendf(buf," Order=%d",(ulong)(uint)(int)(char)pbVar10[-2]);
                }
                if ((bVar14 == 0) && ((int)(char)pbVar10[-1] != 0xffffffff)) {
                  uVar9 = 0x5e;
                  if ((*pbVar10 & 3) == 1) {
                    uVar9 = 0x76;
                  }
                  ImGuiTextBuffer::appendf
                            (buf," Sort=%d%c",(ulong)(uint)(int)(char)pbVar10[-1],uVar9);
                }
                ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
              }
              uVar11 = (int)uVar12 + 1;
              uVar12 = (ulong)uVar11;
              pbVar10 = pbVar10 + 0xc;
            } while ((int)uVar11 < (int)(char)puVar13[3]);
          }
          ImGuiTextBuffer::append(buf,"\n",(char *)0x0);
        }
      }
      puVar13 = (uint *)((long)(int)puVar13[-1] + (long)puVar13);
    } while (puVar13 !=
             (uint *)((ctx->SettingsTables).Buf.Data + (long)(ctx->SettingsTables).Buf.Size + 4));
  }
  return;
}

Assistant:

static void TableSettingsHandler_WriteAll(ImGuiContext* ctx, ImGuiSettingsHandler* handler, ImGuiTextBuffer* buf)
{
    ImGuiContext& g = *ctx;
    for (ImGuiTableSettings* settings = g.SettingsTables.begin(); settings != NULL; settings = g.SettingsTables.next_chunk(settings))
    {
        if (settings->ID == 0) // Skip ditched settings
            continue;

        // TableSaveSettings() may clear some of those flags when we establish that the data can be stripped
        // (e.g. Order was unchanged)
        const bool save_size    = (settings->SaveFlags & ImGuiTableFlags_Resizable) != 0;
        const bool save_visible = (settings->SaveFlags & ImGuiTableFlags_Hideable) != 0;
        const bool save_order   = (settings->SaveFlags & ImGuiTableFlags_Reorderable) != 0;
        const bool save_sort    = (settings->SaveFlags & ImGuiTableFlags_Sortable) != 0;
        if (!save_size && !save_visible && !save_order && !save_sort)
            continue;

        buf->reserve(buf->size() + 30 + settings->ColumnsCount * 50); // ballpark reserve
        buf->appendf("[%s][0x%08X,%d]\n", handler->TypeName, settings->ID, settings->ColumnsCount);
        if (settings->RefScale != 0.0f)
            buf->appendf("RefScale=%g\n", settings->RefScale);
        ImGuiTableColumnSettings* column = settings->GetColumnSettings();
        for (int column_n = 0; column_n < settings->ColumnsCount; column_n++, column++)
        {
            // "Column 0  UserID=0x42AD2D21 Width=100 Visible=1 Order=0 Sort=0v"
            bool save_column = column->UserID != 0 || save_size || save_visible || save_order || (save_sort && column->SortOrder != -1);
            if (!save_column)
                continue;
            buf->appendf("Column %-2d", column_n);
            if (column->UserID != 0)                    buf->appendf(" UserID=%08X", column->UserID);
            if (save_size && column->IsStretch)         buf->appendf(" Weight=%.4f", column->WidthOrWeight);
            if (save_size && !column->IsStretch)        buf->appendf(" Width=%d", (int)column->WidthOrWeight);
            if (save_visible)                           buf->appendf(" Visible=%d", column->IsEnabled);
            if (save_order)                             buf->appendf(" Order=%d", column->DisplayOrder);
            if (save_sort && column->SortOrder != -1)   buf->appendf(" Sort=%d%c", column->SortOrder, (column->SortDirection == ImGuiSortDirection_Ascending) ? 'v' : '^');
            buf->append("\n");
        }
        buf->append("\n");
    }
}